

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O3

string * __thiscall
booster::locale::impl_icu::utf8_converter_impl::convert_abi_cxx11_
          (string *__return_storage_ptr__,utf8_converter_impl *this,conversion_type how,char *begin,
          char *end,int flags)

{
  code *func;
  UnicodeString str;
  icu_std_converter<char,_1> cvt;
  string local_b8;
  icu_std_converter<char,_1> local_98;
  icu_std_converter<char,_1> local_58;
  
  switch(how) {
  case normalization:
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"UTF-8","");
    icu_std_converter<char,_1>::icu_std_converter(&local_58,&local_b8,cvt_skip);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    icu_std_converter<char,_1>::icu(&local_98,(char_type *)&local_58,begin);
    anon_unknown_12::normalize_string((UnicodeString *)&local_98,flags);
    icu_std_converter<char,1>::std_abi_cxx11_
              (__return_storage_ptr__,&local_58,(UnicodeString *)&local_98);
    icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.charset_._M_dataplus._M_p == &local_58.charset_.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_58.charset_._M_dataplus._M_p);
    return __return_storage_ptr__;
  case upper_case:
    func = ucasemap_utf8ToUpper_70;
    break;
  case lower_case:
    func = ucasemap_utf8ToLower_70;
    break;
  case case_folding:
    func = ucasemap_utf8FoldCase_70;
    break;
  case title_case:
    raii_casemap::raii_casemap((raii_casemap *)&local_98,&this->locale_id_);
    raii_casemap::convert<int(*)(UCaseMap*,char*,int,char_const*,int,UErrorCode*)>
              (__return_storage_ptr__,(raii_casemap *)&local_98,ucasemap_utf8ToTitle_70,begin,end);
    ucasemap_close_70(local_98._0_8_);
    return __return_storage_ptr__;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,begin,end);
    return __return_storage_ptr__;
  }
  raii_casemap::convert<int(*)(UCaseMap_const*,char*,int,char_const*,int,UErrorCode*)>
            (__return_storage_ptr__,&this->map_,func,begin,end);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string convert(converter_base::conversion_type how,char const *begin,char const *end,int flags = 0) const
        {
            
            if(how == converter_base::normalization) {
                icu_std_converter<char> cvt("UTF-8");
                icu::UnicodeString str=cvt.icu(begin,end);
                normalize_string(str,flags);
                return cvt.std(str);
            }
            
            switch(how) 
            {
            case converter_base::upper_case:
                return map_.convert(ucasemap_utf8ToUpper,begin,end);
            case converter_base::lower_case:
                return map_.convert(ucasemap_utf8ToLower,begin,end);
            case converter_base::title_case:
                {
                    // Non-const method, so need to create a separate map
                    raii_casemap map(locale_id_);
                    return map.convert(ucasemap_utf8ToTitle,begin,end);
                }
            case converter_base::case_folding:
                return map_.convert(ucasemap_utf8FoldCase,begin,end);
            default:
                return std::string(begin,end-begin);
            }
        }